

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cmime_message.c
# Opt level: O0

void cmime_message_add_attachment(CMimeMessage_T *message,char *attachment)

{
  char *pcVar1;
  CMimePart_T *prev;
  CMimeListElem_T *elem;
  CMimePart_T *part;
  char *attachment_local;
  CMimeMessage_T *message_local;
  
  part = (CMimePart_T *)attachment;
  attachment_local = (char *)message;
  if (message == (CMimeMessage_T *)0x0) {
    __assert_fail("message",
                  "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                  ,0x492,"void cmime_message_add_attachment(CMimeMessage_T *, char *)");
  }
  if (attachment != (char *)0x0) {
    elem = (CMimeListElem_T *)cmime_part_new();
    if (0 < **(int **)(attachment_local + 0x28)) {
      *(undefined2 *)(**(long **)(*(long *)(attachment_local + 0x28) + 0x18) + 0x28) = 0;
    }
    cmime_message_add_generated_boundary((CMimeMessage_T *)attachment_local);
    cmime_part_from_file((CMimePart_T **)&elem,(char *)part,*(char **)(attachment_local + 0x30));
    pcVar1 = strdup(*(char **)(attachment_local + 0x18));
    elem[1].data = pcVar1;
    *(undefined2 *)&elem[1].next = 1;
    cmime_list_append(*(CMimeList_T **)(attachment_local + 0x28),elem);
    return;
  }
  __assert_fail("attachment",
                "/workspace/llm4binary/github/license_c_cmakelists/spmfilter[P]libcmime/src/cmime_message.c"
                ,0x493,"void cmime_message_add_attachment(CMimeMessage_T *, char *)");
}

Assistant:

void cmime_message_add_attachment(CMimeMessage_T *message, char *attachment) {

    assert(message);
    assert(attachment);

    CMimePart_T *part = cmime_part_new();
    CMimeListElem_T *elem = NULL;
    CMimePart_T *prev = NULL;

    /* check if there is a previous part */
    if (message->parts->size >= 1) {
        elem = cmime_list_tail(message->parts);
        prev = cmime_list_data(elem);
        prev->last = 0;
        
    }
    cmime_message_add_generated_boundary(message);
    cmime_part_from_file(&part, attachment,message->linebreak);
    part->parent_boundary = strdup(message->boundary);
    part->last = 1;
    cmime_list_append(message->parts,part);

}